

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O2

void re2::RegexpBigRef(void)

{
  Regexp *this;
  int iVar1;
  bool bVar2;
  LogMessageFatal local_190;
  
  local_190.super_LogMessage._0_8_ = "x";
  local_190.super_LogMessage._8_4_ = 1;
  this = Regexp::Parse((StringPiece *)&local_190,NoParseFlags,(RegexpStatus *)0x0);
  iVar1 = 100000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    Regexp::Incref(this);
  }
  iVar1 = 100000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    Regexp::Decref(this);
  }
  iVar1 = Regexp::Ref(this);
  if (iVar1 != 1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x16);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (re->Ref()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  Regexp::Decref(this);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}